

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMemoryAllocation.h
# Opt level: O3

bool okAssign<int>(vector<int,_std::allocator<int>_> *use_vector,HighsInt dimension,int value)

{
  int local_c;
  
  local_c = value;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(use_vector,(long)dimension,&local_c);
  return true;
}

Assistant:

bool okAssign(std::vector<T>& use_vector, HighsInt dimension, T value = T{}) {
  try {
    use_vector.assign(dimension, value);
  } catch (const std::bad_alloc& e) {
    printf("HighsMemoryAllocation::okAssign fails with %s\n", e.what());
    return false;
  }
  return true;
}